

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.cpp
# Opt level: O2

optional<uint256> *
node::ReadSnapshotBaseBlockhash(optional<uint256> *__return_storage_ptr__,path chaindir)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  int iVar3;
  FILE *pFVar4;
  Logger *pLVar5;
  path *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  char *flag;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function_02;
  Level level;
  char *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_178;
  string local_158;
  string read_from_str;
  path local_118;
  path read_from;
  string local_68;
  uint256 base_blockhash;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::filesystem::exists(in_RSI);
  if (!bVar2) {
    std::filesystem::__cxx11::path::string((string *)&read_from,in_RSI);
    logging_function._M_str = "ReadSnapshotBaseBlockhash";
    logging_function._M_len = 0x19;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/utxo_snapshot.cpp"
    ;
    source_file_00._M_len = 0x5f;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function,source_file_00,0x35,
               I2P|VALIDATION|QT|COINDB|LIBEVENT|PRUNE|SELECTCOINS|ADDRMAN|WALLETDB|HTTP|TOR|NET,
               (Level)(string *)&read_from,in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
    std::__cxx11::string::~string((string *)&read_from);
    (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
    super__Optional_payload_base<uint256>._M_engaged = false;
    goto LAB_003eaeba;
  }
  std::filesystem::__cxx11::path::path(&local_118,in_RSI);
  fs::operator/(&read_from,(path *)&local_118,(path *)SNAPSHOT_BLOCKHASH_FILENAME);
  std::filesystem::__cxx11::path::~path(&local_118);
  std::filesystem::__cxx11::path::string(&read_from_str,&read_from.super_path);
  bVar2 = std::filesystem::exists(&read_from.super_path);
  if (bVar2) {
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    base_blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    pFVar4 = fsbridge::fopen((char *)&read_from,"rb");
    local_68._M_string_length = 0;
    local_68.field_2._M_allocated_capacity = 0;
    local_68.field_2._8_8_ = 0;
    local_178._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68._M_dataplus._M_p = (pointer)pFVar4;
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_178);
    level = (Level)&read_from_str;
    if (pFVar4 == (FILE *)0x0) {
      logging_function_00._M_str = "ReadSnapshotBaseBlockhash";
      logging_function_00._M_len = 0x19;
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/utxo_snapshot.cpp"
      ;
      source_file_01._M_len = 0x5f;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function_00,source_file_01,0x47,
                 I2P|VALIDATION|QT|COINDB|LIBEVENT|PRUNE|SELECTCOINS|ADDRMAN|ESTIMATEFEE|ZMQ|TOR|NET
                 ,level,in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
      bVar2 = false;
    }
    else {
      base_blob<256U>::Unserialize<AutoFile>
                (&base_blockhash.super_base_blob<256U>,(AutoFile *)&local_68);
      iVar3 = fgetc((FILE *)local_68._M_dataplus._M_p);
      if (iVar3 == -1) {
        iVar3 = ferror((FILE *)local_68._M_dataplus._M_p);
        if (iVar3 != 0) {
          flag = "[snapshot] warning: i/o error reading %s\n";
          iVar3 = 0x4f;
          goto LAB_003eae58;
        }
      }
      else {
        flag = "[snapshot] warning: unexpected trailing data in %s\n";
        iVar3 = 0x4d;
LAB_003eae58:
        logging_function_01._M_str = "ReadSnapshotBaseBlockhash";
        logging_function_01._M_len = 0x19;
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/utxo_snapshot.cpp"
        ;
        source_file_02._M_len = 0x5f;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function_01,source_file_02,iVar3,(LogFlags)flag,level,
                   in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 0x10) =
           base_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 0x18) =
           base_blockhash.super_base_blob<256U>.m_data._M_elems._24_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
        super__Optional_payload_base<uint256>._M_payload =
           base_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 8) =
           base_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_;
      bVar2 = true;
    }
    (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
    super__Optional_payload_base<uint256>._M_engaged = bVar2;
    AutoFile::~AutoFile((AutoFile *)&local_68);
  }
  else {
    std::filesystem::__cxx11::path::string(&local_158,in_RSI);
    pLVar5 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar5);
    if (bVar2) {
      base_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
           base_blockhash.super_base_blob<256U>.m_data._M_elems + 0x10;
      base_blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ =
           base_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ & 0xffffffffffffff00;
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                (&local_68,
                 (tinyformat *)
                 "[snapshot] snapshot chainstate dir is malformed! no base blockhash file exists at path %s. Try deleting %s and calling loadtxoutset again?\n"
                 ,(char *)&local_158,&read_from_str,in_R8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &base_blockhash,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      pLVar5 = LogInstance();
      local_68._M_dataplus._M_p = (pointer)0x5f;
      local_68._M_string_length = 0x6e44cb;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/utxo_snapshot.cpp"
      ;
      source_file._M_len = 0x5f;
      str._M_str = (char *)base_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_;
      str._M_len._0_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[8];
      str._M_len._1_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[9];
      str._M_len._2_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[10];
      str._M_len._3_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[0xb];
      str._M_len._4_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[0xc];
      str._M_len._5_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[0xd];
      str._M_len._6_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[0xe];
      str._M_len._7_1_ = base_blockhash.super_base_blob<256U>.m_data._M_elems[0xf];
      logging_function_02._M_str = "ReadSnapshotBaseBlockhash";
      logging_function_02._M_len = 0x19;
      BCLog::Logger::LogPrintStr(pLVar5,str,logging_function_02,source_file,0x3e,ALL,Info);
      std::__cxx11::string::~string((string *)&base_blockhash);
    }
    std::__cxx11::string::~string((string *)&local_158);
    (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
    super__Optional_payload_base<uint256>._M_engaged = false;
  }
  std::__cxx11::string::~string((string *)&read_from_str);
  std::filesystem::__cxx11::path::~path(&read_from.super_path);
LAB_003eaeba:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uint256> ReadSnapshotBaseBlockhash(fs::path chaindir)
{
    if (!fs::exists(chaindir)) {
        LogPrintf("[snapshot] cannot read base blockhash: no chainstate dir "
            "exists at path %s\n", fs::PathToString(chaindir));
        return std::nullopt;
    }
    const fs::path read_from = chaindir / node::SNAPSHOT_BLOCKHASH_FILENAME;
    const std::string read_from_str = fs::PathToString(read_from);

    if (!fs::exists(read_from)) {
        LogPrintf("[snapshot] snapshot chainstate dir is malformed! no base blockhash file "
            "exists at path %s. Try deleting %s and calling loadtxoutset again?\n",
            fs::PathToString(chaindir), read_from_str);
        return std::nullopt;
    }

    uint256 base_blockhash;
    FILE* file{fsbridge::fopen(read_from, "rb")};
    AutoFile afile{file};
    if (afile.IsNull()) {
        LogPrintf("[snapshot] failed to open base blockhash file for reading: %s\n",
            read_from_str);
        return std::nullopt;
    }
    afile >> base_blockhash;

    if (std::fgetc(afile.Get()) != EOF) {
        LogPrintf("[snapshot] warning: unexpected trailing data in %s\n", read_from_str);
    } else if (std::ferror(afile.Get())) {
        LogPrintf("[snapshot] warning: i/o error reading %s\n", read_from_str);
    }
    return base_blockhash;
}